

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::SetDstReg(LinearScan *this,Instr *instr)

{
  uint uVar1;
  StackSym *this_00;
  Lifetime *this_01;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  IRType IVar5;
  BOOLEAN BVar6;
  uint newUseValue;
  uint uVar7;
  Opnd *pOVar8;
  RegOpnd *this_02;
  Opnd *this_03;
  Opnd *this_04;
  undefined4 *puVar9;
  SymOpnd *newDst;
  RegOpnd *pRVar10;
  RegNum reg_2;
  Opnd *src;
  IRType srcType;
  Opnd *src2;
  Opnd *src1;
  RegNum reg_1;
  uint32 useCountCost;
  Lifetime *lifetime;
  RegNum reg;
  StackSym *stackSym;
  RegNum callSetupReg;
  RegOpnd *regOpnd;
  Opnd *dst;
  Instr *instr_local;
  LinearScan *this_local;
  
  pOVar8 = IR::Instr::GetDst(instr);
  if (pOVar8 != (Opnd *)0x0) {
    bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
    if (bVar3) {
      this_02 = IR::Opnd::AsRegOpnd(pOVar8);
      if (((byte)this_02->field_0x18 >> 1 & 1) != 0) {
        RVar4 = IR::RegOpnd::GetReg(this_02);
        BVUnitT<unsigned_long>::Set(&this->callSetupRegs,(uint)RVar4);
      }
      this_00 = this_02->m_sym;
      if ((this_00 == (StackSym *)0x0) || (bVar3 = StackSym::IsArgSlotSym(this_00), bVar3)) {
        RVar4 = IR::RegOpnd::GetReg(this_02);
        bVar3 = IsAllocatable(this,RVar4);
        if (bVar3) {
          SpillReg(this,RVar4,false);
        }
        BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar4);
      }
      else {
        RVar4 = IR::RegOpnd::GetReg(this_02);
        if (RVar4 == RegNOREG) {
          this_01 = *(Lifetime **)&(this_00->scratch).globOpt;
          newUseValue = GetUseSpillCost(this->loopNest,
                                        (uint)(this->currentOpHelperBlock != (OpHelperBlock *)0x0));
          Lifetime::SubFromUseCount(this_01,newUseValue,this->curLoop);
          if ((*(ushort *)&this_01->field_0x9c & 1) == 0) {
            if ((*(ushort *)&this_01->field_0x9c >> 4 & 1) != 0) {
              bVar3 = IsInHelperBlock(this);
              if (!bVar3) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x3c1,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              uVar1 = this_01->start;
              uVar7 = HelperBlockStartInstrNumber(this);
              if (uVar7 <= uVar1) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x3c2,"(lifetime->start < this->HelperBlockStartInstrNumber())",
                                   "lifetime->start < this->HelperBlockStartInstrNumber()");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              RVar4 = this_01->reg;
              BVar6 = BVUnitT<unsigned_long>::Test(&this->opHelperSpilledRegs,(uint)RVar4);
              if (BVar6 == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x3c5,"(this->opHelperSpilledRegs.Test(reg))",
                                   "this->opHelperSpilledRegs.Test(reg)");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              BVar6 = BVUnitT<unsigned_long>::Test(&this->activeRegs,(uint)RVar4);
              if (BVar6 != '\0') {
                SpillReg(this,RVar4,false);
              }
              SetCantOpHelperSpill(this,this_01);
              AddToActive(this,this_01);
              BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar4);
              BVUnitT<unsigned_long>::Set(&this->activeRegs,(uint)RVar4);
              if (RegTypes[RVar4] == TyInt64) {
                this->intRegUsedCount = this->intRegUsedCount + 1;
              }
              else {
                if (RegTypes[RVar4] != TyFloat64) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                     ,0x3de,"(RegTypes[reg] == TyFloat64)",
                                     "RegTypes[reg] == TyFloat64");
                  if (!bVar3) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                this->floatRegUsedCount = this->floatRegUsedCount + 1;
              }
            }
            RecordDef(this,this_01,instr,newUseValue);
          }
          else {
            bVar3 = StackSym::IsConst(this_00);
            if ((bVar3) && (bVar3 = IsSymNonTempLocalVar(this,this_00), !bVar3)) {
              return;
            }
            src1._3_1_ = IR::RegOpnd::GetReg(this_02);
            if (src1._3_1_ == RegNOREG) {
              this_03 = IR::Instr::GetSrc1(instr);
              this_04 = IR::Instr::GetSrc2(instr);
              if ((((this_03 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsRegOpnd(this_03), bVar3)) &&
                  (pRVar10 = IR::Opnd::AsRegOpnd(this_03), pRVar10->m_sym == this_00)) ||
                 (((this_04 != (Opnd *)0x0 && (bVar3 = IR::Opnd::IsRegOpnd(this_04), bVar3)) &&
                  (pRVar10 = IR::Opnd::AsRegOpnd(this_04), pRVar10->m_sym == this_00)))) {
                IVar5 = IR::Opnd::GetType(pOVar8);
                src1._3_1_ = GetAssignedTempReg(this,this_01,IVar5);
                if (src1._3_1_ == RegNOREG) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                     ,0x37c,"(reg != RegNOREG)","reg != RegNOREG");
                  if (!bVar3) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                RecordDef(this,this_01,instr,0);
              }
              else {
                RVar4 = SecondChanceAllocation(this,this_01,false);
                if (RVar4 != RegNOREG) {
                  if ((*(uint *)&this_00->field_0x18 & 1) != 0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar9 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                       ,0x386,"(!stackSym->m_isSingleDef)",
                                       "!stackSym->m_isSingleDef");
                    if (!bVar3) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar9 = 0;
                  }
                  SetReg(this,this_02);
                  RecordDef(this,this_01,instr,newUseValue);
                  return;
                }
                IVar5 = IR::Opnd::GetType(pOVar8);
                src1._3_1_ = GetAssignedTempReg(this,this_01,IVar5);
                RecordDef(this,this_01,instr,0);
              }
              bVar3 = LowererMD::IsAssign(instr);
              if (bVar3) {
                pOVar8 = IR::Instr::GetSrc1(instr);
                bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
                if (bVar3) {
                  if (src1._3_1_ != RegNOREG) {
                    BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)src1._3_1_);
                  }
                  pOVar8 = IR::Instr::GetSrc1(instr);
                  IVar5 = IR::Opnd::GetType(pOVar8);
                  newDst = IR::SymOpnd::New(&this_00->super_Sym,IVar5,this->func);
                  IR::Instr::ReplaceDst(instr,&newDst->super_Opnd);
                  LinearScanMD::LegalizeDef(&this->linearScanMD,instr);
                  return;
                }
              }
              if (src1._3_1_ == RegNOREG) {
                pOVar8 = IR::Instr::GetSrc1(instr);
                if (((pOVar8 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsRegOpnd(pOVar8), !bVar3)) ||
                   (pRVar10 = IR::Opnd::AsRegOpnd(pOVar8), pRVar10->m_sym != this_00)) {
                  src1._3_1_ = FindReg(this,(Lifetime *)0x0,this_02,false);
                }
                else {
                  pRVar10 = IR::Opnd::AsRegOpnd(pOVar8);
                  src1._3_1_ = IR::RegOpnd::GetReg(pRVar10);
                  BVar6 = BVUnitT<unsigned_long>::Test(&this->activeRegs,(uint)src1._3_1_);
                  if (BVar6 != '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar9 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                       ,0x3aa,"(!this->activeRegs.Test(reg))","Shouldn\'t be active"
                                      );
                    if (!bVar3) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar9 = 0;
                  }
                }
                AssignTempReg(this,this_01,src1._3_1_);
              }
            }
            else {
              AssignTempReg(this,this_01,src1._3_1_);
            }
            if (((*(ushort *)&this_01->field_0x9c >> 3 & 1) == 0) &&
               ((*(ushort *)&this_01->field_0x9c >> 9 & 1) == 0)) {
              InsertStore(this,instr,this_02->m_sym,src1._3_1_);
            }
          }
          SetReg(this,this_02);
        }
        else {
          RVar4 = IR::RegOpnd::GetReg(this_02);
          RecordLoopUse(this,(Lifetime *)0x0,RVar4);
        }
      }
    }
    else {
      LinearScanMD::LegalizeDef(&this->linearScanMD,instr);
    }
  }
  return;
}

Assistant:

void
LinearScan::SetDstReg(IR::Instr *instr)
{
    //
    // Enregister dst
    //

    IR::Opnd *dst = instr->GetDst();

    if (dst == nullptr)
    {
        return;
    }

    if (!dst->IsRegOpnd())
    {
        // This could be, for instance, a store to a sym with a large offset
        // that was just assigned when we saw the use.
        this->linearScanMD.LegalizeDef(instr);
        return;
    }

    IR::RegOpnd * regOpnd = dst->AsRegOpnd();
    /*
     * If this is a register used to setup a callsite per
     * a calling convention then mark it unavailable to allocate
     * until we see a CALL.
     */
    if (regOpnd->m_isCallArg)
    {
        RegNum callSetupReg = regOpnd->GetReg();
        callSetupRegs.Set(callSetupReg);
    }

    StackSym * stackSym = regOpnd->m_sym;

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Just use the assigned register
    if (stackSym == nullptr || stackSym->IsArgSlotSym())
    {
        //
        // Already allocated register. just spill the destination
        //
        RegNum reg = regOpnd->GetReg();
        if(LinearScan::IsAllocatable(reg))
        {
            this->SpillReg(reg);
        }
        this->tempRegs.Clear(reg);
    }
    else
    {
        if (regOpnd->GetReg() != RegNOREG)
        {
            this->RecordLoopUse(nullptr, regOpnd->GetReg());
            // Nothing to do
            return;
        }

        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr));
        // Optimistically decrease the useCount.  We'll undo this if we put it on the defList.
        lifetime->SubFromUseCount(useCountCost, this->curLoop);

        if (lifetime->isSpilled)
        {
            if (stackSym->IsConst() && !IsSymNonTempLocalVar(stackSym))
            {
                // We will reload the constant (but in debug mode, we still need to process this if this is a user var).
                return;
            }

            RegNum reg = regOpnd->GetReg();

            if (reg != RegNOREG)
            {
                // It is already assigned, just record it as a temp reg
                this->AssignTempReg(lifetime, reg);
            }
            else
            {
                IR::Opnd *src1 = instr->GetSrc1();
                IR::Opnd *src2 = instr->GetSrc2();

                if ((src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym) ||
                    (src2 && src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym))
                {
                    // OpEQ: src1 should have a valid reg (put src2 for other targets)
                    reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                    Assert(reg != RegNOREG);
                    RecordDef(lifetime, instr, 0);
                }
                else
                {
                    // Try second chance
                    reg = this->SecondChanceAllocation(lifetime, false);
                    if (reg != RegNOREG)
                    {

                        Assert(!stackSym->m_isSingleDef);

                        this->SetReg(regOpnd);
                        // Keep track of defs for this lifetime, in case it gets spilled.
                        RecordDef(lifetime, instr, useCountCost);
                        return;
                    }
                    else
                    {
                        reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                        RecordDef(lifetime, instr, 0);
                    }
                }
                if (LowererMD::IsAssign(instr) && instr->GetSrc1()->IsRegOpnd())
                {
                    // Fold the spilled store
                    if (reg != RegNOREG)
                    {
                        // If the value is in a temp reg, it's not valid any more.
                        this->tempRegs.Clear(reg);
                    }

                    IRType srcType = instr->GetSrc1()->GetType();

                    instr->ReplaceDst(IR::SymOpnd::New(stackSym, srcType, this->func));
                    this->linearScanMD.LegalizeDef(instr);
                    return;
                }

                if (reg == RegNOREG)
                {
                    IR::Opnd *src = instr->GetSrc1();
                    if (src && src->IsRegOpnd() && src->AsRegOpnd()->m_sym == stackSym)
                    {
                        // Handle OPEQ's for x86/x64
                        reg = src->AsRegOpnd()->GetReg();
                        AssertMsg(!this->activeRegs.Test(reg), "Shouldn't be active");
                    }
                    else
                    {
                        // The lifetime was spilled, but we still need a reg for this operand.
                        reg = this->FindReg(nullptr, regOpnd);
                    }
                    this->AssignTempReg(lifetime, reg);
                }
            }

            if (!lifetime->isDeadStore && !lifetime->isSecondChanceAllocated)
            {
                // Insert a store since the lifetime is spilled
                this->InsertStore(instr, regOpnd->m_sym, reg);
            }
        }
        else
        {
            if (lifetime->isOpHelperSpilled)
            {
                // We must be in a helper block and the lifetime must
                // start before the helper block
                Assert(this->IsInHelperBlock());
                Assert(lifetime->start < this->HelperBlockStartInstrNumber());

                RegNum reg = lifetime->reg;
                Assert(this->opHelperSpilledRegs.Test(reg));

                if (this->activeRegs.Test(reg))
                {
                    // The reg must have been used locally in the helper block
                    // by some other lifetime. Just spill it

                    this->SpillReg(reg);
                }

                // We can't save/restore this reg across the helper call because the restore would overwrite
                // this def, but the def means we don't need to spill at all.  Mark the lifetime as cantOpHelperSpill
                // however in case another helper call in this block tries to spill it.
                this->SetCantOpHelperSpill(lifetime);

                this->AddToActive(lifetime);

                this->tempRegs.Clear(reg);
                this->activeRegs.Set(reg);
                if (RegTypes[reg] == TyMachReg)
                {
                    this->intRegUsedCount++;
                }
                else
                {
                    Assert(RegTypes[reg] == TyFloat64);
                    this->floatRegUsedCount++;
                }
            }

            // Keep track of defs for this lifetime, in case it gets spilled.
            RecordDef(lifetime, instr, useCountCost);
        }

        this->SetReg(regOpnd);
    }
}